

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9InitCodeGenerator(jx9_vm *pVm,ProcConsumer xErr,void *pErrData)

{
  sxu32 nFirstInstr;
  jx9_gen_state *pGen_00;
  jx9_gen_state *pGen;
  void *pErrData_local;
  ProcConsumer xErr_local;
  jx9_vm *pVm_local;
  
  pGen_00 = &pVm->sCodeGen;
  SyZero(pGen_00,0x170);
  pGen_00->pVm = pVm;
  (pVm->sCodeGen).xErr = xErr;
  (pVm->sCodeGen).pErrData = pErrData;
  SyHashInit(&(pVm->sCodeGen).hLiteral,&pVm->sAllocator,(ProcHash)0x0,(ProcCmp)0x0);
  SyHashInit(&(pVm->sCodeGen).hVar,&pVm->sAllocator,(ProcHash)0x0,(ProcCmp)0x0);
  nFirstInstr = jx9VmInstrLength(pVm);
  GenStateInitBlock(pGen_00,&(pVm->sCodeGen).sGlobal,0x10,nFirstInstr,(void *)0x0);
  (pVm->sCodeGen).pCurrent = &(pVm->sCodeGen).sGlobal;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9InitCodeGenerator(
	jx9_vm *pVm,       /* Target VM */
	ProcConsumer xErr, /* Error log consumer callabck  */
	void *pErrData     /* Last argument to xErr() */
	)
{
	jx9_gen_state *pGen = &pVm->sCodeGen;
	/* Zero the structure */
	SyZero(pGen, sizeof(jx9_gen_state));
	/* Initial state */
	pGen->pVm  = &(*pVm);
	pGen->xErr = xErr;
	pGen->pErrData = pErrData;
	SyHashInit(&pGen->hLiteral, &pVm->sAllocator, 0, 0);
	SyHashInit(&pGen->hVar, &pVm->sAllocator, 0, 0);
	/* Create the global scope */
	GenStateInitBlock(pGen, &pGen->sGlobal,GEN_BLOCK_GLOBAL,jx9VmInstrLength(&(*pVm)), 0);
	/* Point to the global scope */
	pGen->pCurrent = &pGen->sGlobal;
	return SXRET_OK;
}